

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

type_conflict jsteemann::atoi<long>(char *p,char *e,int *errcode)

{
  int *errcode_local;
  char *e_local;
  char *p_local;
  
  if (p == e) {
    *errcode = -1;
    p_local = (char *)0x0;
  }
  else if (*p == '-') {
    p_local = (char *)atoi_negative<long>(p + 1,e,errcode);
  }
  else {
    e_local = p;
    if (*p == '+') {
      e_local = p + 1;
    }
    p_local = (char *)atoi_positive<long>(e_local,e,errcode);
  }
  return (type_conflict)p_local;
}

Assistant:

inline typename std::enable_if<std::is_signed<T>::value, T>::type atoi(char const* p, char const* e, int& errcode) JSTEEMANN_NOEXCEPT {
  if (ATOI_UNLIKELY(p == e)) {
    errcode = -1;
    return T();
  }

  if (*p == '-') {
    return atoi_negative<T>(++p, e, errcode);
  }
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }

  return atoi_positive<T>(p, e, errcode);
}